

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_close_outfile(mcpl_outfile_t of)

{
  uint64_t in_RDI;
  FILE *unaff_retaddr;
  mcpl_outfileinternal_t *f;
  mcpl_outfileinternal_t *in_stack_00000040;
  uint64_t n;
  
  n = in_RDI;
  if (*(int *)(in_RDI + 0x60) != 0) {
    mcpl_write_header(in_stack_00000040);
  }
  if (*(long *)(in_RDI + 0x68) != 0) {
    mcpl_update_nparticles(unaff_retaddr,n);
  }
  mcpl_internal_cleanup_outfile((mcpl_outfileinternal_t *)0x104585);
  return;
}

Assistant:

void mcpl_close_outfile(mcpl_outfile_t of)
{
  MCPLIMP_OUTFILEDECODE;
  if (f->header_notwritten)
    mcpl_write_header(f);
  if (f->nparticles)
    mcpl_update_nparticles(f->file,f->nparticles);
  mcpl_internal_cleanup_outfile(f);
}